

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dsk.c
# Opt level: O3

LispPTR COM_writepage(LispPTR *args)

{
  uint uVar1;
  int iVar2;
  uint uVar3;
  int *piVar4;
  __off_t _Var5;
  ssize_t sVar6;
  uint uVar7;
  uint uVar8;
  DLword *pDVar9;
  
  iVar2 = _setjmp((__jmp_buf_tag *)jmpbuf);
  if (iVar2 == 0) {
    uVar7 = args[4];
    if ((uVar7 & 1) != 0) {
      printf("Misaligned pointer in NativeAligned4FromLAddr 0x%x\n",(ulong)uVar7);
    }
    Lisp_errno = (int *)(Lisp_world + uVar7);
    uVar7 = *args;
    if ((uVar7 & 0xfff0000) == 0xf0000) {
      uVar7 = uVar7 | 0xffff0000;
    }
    else if ((uVar7 & 0xfff0000) == 0xe0000) {
      uVar7 = uVar7 & 0xffff;
    }
    else {
      if ((uVar7 & 1) != 0) {
        printf("Misaligned pointer in NativeAligned4FromLAddr 0x%x\n",(ulong)uVar7);
      }
      uVar7 = *(uint *)(Lisp_world + uVar7);
    }
    uVar8 = args[1];
    if ((uVar8 & 0xfff0000) == 0xf0000) {
      uVar8 = uVar8 | 0xffff0000;
    }
    else if ((uVar8 & 0xfff0000) == 0xe0000) {
      uVar8 = uVar8 & 0xffff;
    }
    else {
      if ((uVar8 & 1) != 0) {
        printf("Misaligned pointer in NativeAligned4FromLAddr 0x%x\n",(ulong)uVar8);
      }
      uVar8 = *(uint *)(Lisp_world + uVar8);
    }
    pDVar9 = Lisp_world;
    uVar1 = args[2];
    uVar3 = args[3];
    if ((uVar3 & 0xfff0000) == 0xf0000) {
      uVar3 = uVar3 | 0xffff0000;
    }
    else if ((uVar3 & 0xfff0000) == 0xe0000) {
      uVar3 = uVar3 & 0xffff;
    }
    else {
      if ((uVar3 & 1) != 0) {
        printf("Misaligned pointer in NativeAligned4FromLAddr 0x%x\n",(ulong)uVar3);
      }
      uVar3 = *(uint *)(Lisp_world + uVar3);
    }
    pDVar9 = pDVar9 + uVar1;
    do {
      alarm(TIMEOUT_TIME);
      piVar4 = __errno_location();
      do {
        *piVar4 = 0;
        _Var5 = lseek(uVar7,(long)(int)(uVar8 << 9),0);
        if (_Var5 != -1) {
          alarm(0);
          uVar8 = (int)(uVar3 + 3) >> 2;
          word_swap_page(pDVar9,uVar8);
          do {
            alarm(TIMEOUT_TIME);
            do {
              *piVar4 = 0;
              sVar6 = write(uVar7,pDVar9,(long)(int)uVar3);
              if (sVar6 != -1) {
                alarm(0);
                word_swap_page(pDVar9,uVar8);
                return 0x4c;
              }
            } while (*piVar4 == 4);
            alarm(0);
          } while (*piVar4 == 4);
          *Lisp_errno = *piVar4;
          word_swap_page(pDVar9,uVar8);
          return 0;
        }
      } while (*piVar4 == 4);
      alarm(0);
    } while (*piVar4 == 4);
    *Lisp_errno = *piVar4;
  }
  else {
    *Lisp_errno = 100;
  }
  return 0;
}

Assistant:

LispPTR COM_writepage(LispPTR *args)
{
  int fd;
  int npage;
  char *bufp;
  int count;
  ssize_t rval;
  off_t offval;

  ERRSETJMP(NIL);
  Lisp_errno = (int *)NativeAligned4FromLAddr(args[4]);

  fd = LispNumToCInt(args[0]);
  npage = LispNumToCInt(args[1]);
  bufp = (char *)NativeAligned2FromLAddr(args[2]);
  count = LispNumToCInt(args[3]);

sklp2:
  TIMEOUT(offval = lseek(fd, (npage * FDEV_PAGE_SIZE), SEEK_SET));
  if (offval == -1) {
    if (errno == EINTR) goto sklp2; /* interrupted; retry */
    *Lisp_errno = errno;
    return (NIL);
  }

/* OK to write the page. */

#ifdef BYTESWAP
  word_swap_page((DLword *)bufp, (count + 3) >> 2);
#endif /* BYTESWAP */

wlp:
  TIMEOUT(rval = write(fd, bufp, count));
  if (rval == -1) {
    if (errno == EINTR) goto wlp; /* interrupted; retry */
    *Lisp_errno = errno;
#ifdef BYTESWAP
    word_swap_page((DLword *)bufp, (count + 3) >> 2);
#endif /* BYTESWAP */
    return (NIL);
  }

#ifdef BYTESWAP
  word_swap_page((DLword *)bufp, (count + 3) >> 2);
#endif /* BYTESWAP */

  return (ATOM_T);
}